

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)400>(Result *__return_storage_ptr__,Model *format)

{
  int iVar1;
  bool bVar2;
  GLMClassifier *pGVar3;
  Int64Vector *pIVar4;
  StringVector *pSVar5;
  Type *pTVar6;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  int i;
  int iVar7;
  ModelDescription *from;
  undefined1 in_R9B;
  allocator local_151;
  string local_150;
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> weights;
  GLMClassifier glmClassifier;
  Result result;
  ModelDescription interface;
  
  from = format->description_;
  if (from == (ModelDescription *)0x0) {
    from = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Specification::ModelDescription::ModelDescription(&interface,from);
  pGVar3 = Specification::Model::glmclassifier(format);
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::GLMClassifier>
            (&result,(CoreML *)format,(Model *)pGVar3,(GLMClassifier *)0x0,false,(bool)in_R9B);
  bVar2 = Result::good(&result);
  if (bVar2) {
    validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&glmClassifier,(CoreML *)&interface.input_,features);
    Result::operator=(&result,(Result *)&glmClassifier);
    std::__cxx11::string::~string((string *)&glmClassifier._internal_metadata_);
    bVar2 = Result::good(&result);
    if (bVar2) {
      pGVar3 = Specification::Model::glmclassifier(format);
      Specification::GLMClassifier::GLMClassifier(&glmClassifier,pGVar3);
      if ((uint)glmClassifier.postevaluationtransform_ < 2) {
        if (1 < (uint)glmClassifier.classencoding_) {
          std::__cxx11::string::string
                    ((string *)&local_150,"Invalid class encoding",(allocator *)&weights);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
          goto LAB_00210c87;
        }
        if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ == 0) {
          std::__cxx11::string::string
                    ((string *)&local_150,
                     "The number of DoubleArrays in weights must be greater than zero",
                     (allocator *)&weights);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
          goto LAB_00210c87;
        }
        if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ !=
            glmClassifier.offset_.current_size_) {
          std::__cxx11::string::string
                    ((string *)&local_150,
                     "The number of DoubleArrays in weights must match number of offsets",
                     (allocator *)&weights);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
          goto LAB_00210c87;
        }
        if (glmClassifier._oneof_case_[0] == 100) {
          pSVar5 = Specification::GLMClassifier::stringclasslabels(&glmClassifier);
          iVar7 = (pSVar5->vector_).super_RepeatedPtrFieldBase.current_size_;
        }
        else if (glmClassifier._oneof_case_[0] == 0x65) {
          pIVar4 = Specification::GLMClassifier::int64classlabels(&glmClassifier);
          iVar7 = (pIVar4->vector_).current_size_;
        }
        else {
          iVar7 = -1;
        }
        if (glmClassifier.classencoding_ == 0) {
          if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ == iVar7 + -1 ||
              iVar7 == -1) {
LAB_00210d69:
            if ((iVar7 < 3) || (glmClassifier.postevaluationtransform_ != 1)) goto LAB_00210da0;
            std::__cxx11::string::string
                      ((string *)&local_150,
                       "Probit post evaluation transform is only supported for binary classification"
                       ,(allocator *)&weights);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
          }
          else {
            std::__cxx11::string::string
                      ((string *)&local_150,
                       "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes"
                       ,(allocator *)&weights);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
          }
          goto LAB_00210c87;
        }
        if (iVar7 != -1) {
          if (iVar7 == 2) {
            if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ == 1)
            goto LAB_00210da0;
            std::__cxx11::string::string
                      ((string *)&local_150,
                       "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one"
                       ,(allocator *)&weights);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
          }
          else {
            if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ == iVar7)
            goto LAB_00210d69;
            std::__cxx11::string::string
                      ((string *)&local_150,
                       "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes"
                       ,(allocator *)&weights);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
          }
          goto LAB_00210c87;
        }
LAB_00210da0:
        google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
        RepeatedPtrField(&weights,&glmClassifier.weights_);
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                           (&weights.super_RepeatedPtrFieldBase,0);
        if ((pTVar6->value_).current_size_ == 0) {
          std::__cxx11::string::string
                    ((string *)&local_150,"Weight DoubleArrays must have nonzero length",&local_151)
          ;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
        }
        else {
          iVar7 = 1;
          do {
            if (weights.super_RepeatedPtrFieldBase.current_size_ <= iVar7) {
              Result::Result(__return_storage_ptr__);
              goto LAB_00210e51;
            }
            pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                               (&weights.super_RepeatedPtrFieldBase,0);
            iVar1 = (pTVar6->value_).current_size_;
            pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                               (&weights.super_RepeatedPtrFieldBase,iVar7);
            iVar7 = iVar7 + 1;
          } while (iVar1 == (pTVar6->value_).current_size_);
          std::__cxx11::string::string
                    ((string *)&local_150,"Weight DoubleArrays must have the same length",&local_151
                    );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
        }
        std::__cxx11::string::~string((string *)&local_150);
LAB_00210e51:
        google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
        ~RepeatedPtrField(&weights);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_150,"Invalid post evaluation transform",(allocator *)&weights);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
LAB_00210c87:
        std::__cxx11::string::~string((string *)&local_150);
      }
      Specification::GLMClassifier::~GLMClassifier(&glmClassifier);
      goto LAB_00210c9b;
    }
  }
  Result::Result(__return_storage_ptr__,&result);
LAB_00210c9b:
  std::__cxx11::string::~string((string *)&result.m_message);
  Specification::ModelDescription::~ModelDescription(&interface);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmClassifier>(const Specification::Model& format) {

        // Check has a classifier interface
        Specification::ModelDescription interface = format.description();
        Result result = validateClassifierInterface(format, format.glmclassifier());
        if (!result.good()) {
            return result;
        }
        
        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(interface.input());
        if (!result.good()) {
            return result;
        }

        Specification::GLMClassifier glmClassifier = format.glmclassifier();

        // Check PostEvluationTransfrom and ClassEncoding have allowed values
        if(glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Logit
           && glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid post evaluation transform");
        }
        if(glmClassifier.classencoding() != Specification::GLMClassifier::ReferenceClass
           && glmClassifier.classencoding() != Specification::GLMClassifier::OneVsRest) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid class encoding");
        }

        // Check has weights and same size as offsets
        int numCoefficient = glmClassifier.weights_size();
        if(numCoefficient == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must be greater than zero");
        }
        if(numCoefficient != glmClassifier.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must match number of offsets");
        }

        // Check number of weight vector makes sense based on the number of classes and the class encoding
        int numClasses;
        switch (glmClassifier.ClassLabels_case()) {
            case Specification::GLMClassifier::kInt64ClassLabels:
                numClasses = glmClassifier.int64classlabels().vector_size();
                break;
            case Specification::GLMClassifier::kStringClassLabels:
                numClasses = glmClassifier.stringclasslabels().vector_size();
                break;
            case Specification::GLMClassifier::CLASSLABELS_NOT_SET:
                numClasses = -1;
                break;
        }
        if(glmClassifier.classencoding() == Specification::GLMClassifier::ReferenceClass) {
            if (numClasses != -1 && numCoefficient != numClasses - 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes");
            }
        } else { // One vs Rest encoding
            if(numClasses == 2) {
                if(numCoefficient != 1) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one");
                }
            } else if (numClasses != -1 && numCoefficient != numClasses) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes");
            }
        }

        // Probit is only supported for binary classification
        if(numClasses > 2 && glmClassifier.postevaluationtransform() == Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Probit post evaluation transform is only supported for binary classification");
        }

        // Check all DoubleArrays in weights have the same, nonzero length
        auto weights = glmClassifier.weights();
        if(weights[0].value_size() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have nonzero length");
        }
        for(int i = 1; i < weights.size(); i++) {
            if(weights[0].value_size() != weights[i].value_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have the same length");
            }
        }

        return Result();
    }